

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O1

void __thiscall
xemmai::t_shared_lock_with_safe_region<std::shared_mutex>::t_shared_lock_with_safe_region
          (t_shared_lock_with_safe_region<std::shared_mutex> *this,shared_mutex *a_mutex)

{
  long *plVar1;
  t_safe_region region;
  t_safe_region local_11;
  
  (this->super_shared_lock<std::shared_mutex>)._M_pm = a_mutex;
  (this->super_shared_lock<std::shared_mutex>)._M_owns = false;
  plVar1 = (long *)__tls_get_addr(&PTR_0010fe28);
  if (*(long *)(*plVar1 + 0x4d8) != 0) {
    xemmai::t_engine::f_debug_safe_region_enter();
  }
  std::shared_lock<std::shared_mutex>::_M_lockable(&this->super_shared_lock<std::shared_mutex>);
  std::__shared_mutex_pthread::lock_shared
            (&((this->super_shared_lock<std::shared_mutex>)._M_pm)->_M_impl);
  (this->super_shared_lock<std::shared_mutex>)._M_owns = true;
  t_safe_region::~t_safe_region(&local_11);
  return;
}

Assistant:

t_shared_lock_with_safe_region(T& a_mutex) : std::shared_lock<T>(a_mutex, std::defer_lock)
	{
		t_safe_region region;
		this->lock();
	}